

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase192::run(TestCase192 *this)

{
  Reader brand;
  undefined1 auVar1 [40];
  SegmentBuilder *pSVar2;
  CapTableBuilder *pCVar3;
  SegmentReader *pSVar4;
  CapTableReader *pCVar5;
  ElementCount EVar6;
  int iVar7;
  long lVar8;
  SegmentBuilder *__s2;
  SegmentBuilder *__s1;
  char *ptrCopy;
  ElementCount index;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Reader RVar14;
  Reader RVar15;
  StructSchema schema;
  Builder field;
  Builder root;
  Builder fields;
  Builder type;
  SchemaLoader loader;
  MallocMessageBuilder schemaBuilder;
  Schema local_270;
  StructBuilder local_268;
  Reader local_238;
  StructReader local_208;
  SegmentBuilder *local_1d8;
  StructBuilder local_1d0;
  PointerBuilder local_1a8;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  SchemaLoader local_150;
  MallocMessageBuilder local_128;
  
  local_1d0.capTable = (CapTableBuilder *)local_1d0.segment;
  SchemaLoader::SchemaLoader(&local_150);
  SchemaLoader::loadNative(&local_150,(RawSchema *)schemas::s_95b30dd14e01dda8);
  local_168 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  uStack_170 = 0;
  uStack_160 = 0x7fffffff;
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  local_128.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)SchemaLoader::get(&local_150,0x95b30dd14e01dda8,brand,(Schema)0x625d60);
  local_270.raw = (RawBrandedSchema *)Schema::asStruct((Schema *)&local_128);
  local_1d0.segment = (SegmentBuilder *)(schemas::s_95b30dd14e01dda8 + 0x48);
  Schema::getProto((Reader *)&local_128,(Schema *)&local_1d0);
  kj::str<capnp::schema::Node::Reader>((String *)&local_238,(Reader *)&local_128);
  Schema::getProto((Reader *)&local_208,&local_270);
  kj::str<capnp::schema::Node::Reader>((String *)&local_268,(Reader *)&local_208);
  pCVar3 = local_268.capTable;
  lVar8 = (long)&((local_268.capTable)->super_CapTableReader)._vptr_CapTableReader +
          (ulong)(local_268.capTable == (CapTableBuilder *)0x0);
  pSVar2 = local_268.segment;
  bVar9 = true;
  if ((long)&(local_238._reader.capTable)->_vptr_CapTableReader +
      (ulong)(local_238._reader.capTable == (CapTableReader *)0x0) == lVar8) {
    __s2 = local_268.segment;
    if (local_268.capTable == (CapTableBuilder *)0x0) {
      __s2 = (SegmentBuilder *)0x4f5114;
    }
    __s1 = (SegmentBuilder *)0x4f5114;
    if (local_238._reader.capTable != (CapTableReader *)0x0) {
      __s1 = (SegmentBuilder *)local_238._reader.segment;
    }
    iVar7 = bcmp(__s1,__s2,lVar8 - 1);
    bVar9 = iVar7 != 0;
  }
  if (pSVar2 != (SegmentBuilder *)0x0) {
    local_268._0_16_ = ZEXT816(0);
    (**(code **)*local_268.data)(local_268.data,pSVar2,1,pCVar3,pCVar3,0);
  }
  pCVar5 = local_238._reader.capTable;
  pSVar4 = local_238._reader.segment;
  if ((SegmentBuilder *)local_238._reader.segment != (SegmentBuilder *)0x0) {
    local_238._reader.segment = (SegmentReader *)0x0;
    local_238._reader.capTable = (CapTableReader *)0x0;
    (**(code **)*local_238._reader.data)(local_238._reader.data,pSVar4,1,pCVar5,pCVar5,0);
  }
  if ((bool)(bVar9 & kj::_::Debug::minSeverity < 3)) {
    local_1d0.segment = (SegmentBuilder *)(schemas::s_95b30dd14e01dda8 + 0x48);
    Schema::getProto((Reader *)&local_128,(Schema *)&local_1d0);
    kj::str<capnp::schema::Node::Reader>((String *)&local_238,(Reader *)&local_128);
    Schema::getProto((Reader *)&local_208,&local_270);
    kj::str<capnp::schema::Node::Reader>((String *)&local_268,(Reader *)&local_208);
    kj::_::Debug::log<char_const(&)[108],kj::String,kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,200,ERROR,
               "\"failed: expected \" \"(kj::str(Schema::from<test::TestOldVersion>().getProto())) == (kj::str(schema.getProto()))\", kj::str(Schema::from<test::TestOldVersion>().getProto()), kj::str(schema.getProto())"
               ,(char (*) [108])
                "failed: expected (kj::str(Schema::from<test::TestOldVersion>().getProto())) == (kj::str(schema.getProto()))"
               ,(String *)&local_238,(String *)&local_268);
    pSVar2 = local_268.segment;
    if (local_268.segment != (SegmentBuilder *)0x0) {
      pCVar3 = local_268.capTable;
      local_268._0_16_ = ZEXT816(0);
      (**(code **)*local_268.data)(local_268.data,pSVar2,1,pCVar3,pCVar3,0);
    }
    pCVar5 = local_238._reader.capTable;
    pSVar4 = local_238._reader.segment;
    if ((SegmentBuilder *)local_238._reader.segment != (SegmentBuilder *)0x0) {
      local_238._reader.segment = (SegmentReader *)0x0;
      local_238._reader.capTable = (CapTableReader *)0x0;
      (**(code **)*local_238._reader.data)(local_238._reader.data,pSVar4,1,pCVar5,pCVar5,0);
    }
  }
  MallocMessageBuilder::MallocMessageBuilder(&local_128,0x400,GROW_HEURISTICALLY);
  local_1d8 = (SegmentBuilder *)(schemas::s_8ed75a7469f04ce3 + 0x48);
  local_1a8.segment = (SegmentBuilder *)(schemas::s_8ed75a7469f04ce3 + 0x48);
  Schema::getProto(&local_238,(Schema *)&local_1a8);
  MessageBuilder::getRootInternal((Builder *)&local_1d0,&local_128.super_MessageBuilder);
  local_208.pointers =
       (WirePointer *)CONCAT44(local_238._reader.pointers._4_4_,(int)local_238._reader.pointers);
  local_208.dataSize = local_238._reader.dataSize;
  local_208.pointerCount = local_238._reader.pointerCount;
  local_208._38_2_ = local_238._reader._38_2_;
  local_208.nestingLimit = local_238._reader.nestingLimit;
  local_208._44_4_ = local_238._reader._44_4_;
  local_208.data = local_238._reader.data;
  local_208.segment = local_238._reader.segment;
  local_208.capTable = local_238._reader.capTable;
  local_268.data = local_1d0.data;
  local_268.segment = local_1d0.segment;
  local_268.capTable = local_1d0.capTable;
  PointerBuilder::setStruct((PointerBuilder *)&local_268,&local_208,false);
  MessageBuilder::getRootInternal((Builder *)&local_268,&local_128.super_MessageBuilder);
  local_208.data = local_268.data;
  local_208.segment = &(local_268.segment)->super_SegmentReader;
  local_208.capTable = &(local_268.capTable)->super_CapTableReader;
  PointerBuilder::getStruct
            ((StructBuilder *)&local_238,(PointerBuilder *)&local_208,(StructSize)0x60005,
             (word *)0x0);
  *(WirePointer *)local_238._reader.data = (WirePointer)0x95b30dd14e01dda8;
  if ((((WirePointer *)((long)local_238._reader.data + 8))->field_1).structRef.dataSize.value == 1)
  {
    local_268.data =
         (void *)(CONCAT44(local_238._reader.pointers._4_4_,(int)local_238._reader.pointers) + 0x18)
    ;
    local_268.segment = (SegmentBuilder *)local_238._reader.segment;
    local_268.capTable = (CapTableBuilder *)local_238._reader.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_208,(PointerBuilder *)&local_268,(StructSize)0x40003,
               (word *)0x0);
    EVar6 = (ElementCount)local_208.pointers;
    if ((ElementCount)local_208.pointers != 0) {
      index = 0;
      do {
        ListBuilder::getStructElement(&local_268,(ListBuilder *)&local_208,index);
        if (*(short *)&((WirePointer *)((long)local_268.data + 8))->offsetAndKind == 0) {
          local_1a8.pointer = local_268.pointers + 2;
          local_1a8.segment = local_268.segment;
          local_1a8.capTable = local_268.capTable;
          PointerBuilder::getStruct(&local_1d0,&local_1a8,(StructSize)0x10003,(word *)0x0);
          if ((*local_1d0.data == 0x10) &&
             (*(WirePointer *)((long)local_1d0.data + 8) == (WirePointer)0x8ed75a7469f04ce3)) {
            ((WirePointer *)((long)local_1d0.data + 8U))->offsetAndKind = 0x4e01dda8;
            ((WirePointer *)((long)local_1d0.data + 8U))->field_1 =
                 (anon_union_4_5_35ddcec3_for_WirePointer_1)0x95b30dd1;
          }
        }
        index = index + 1;
      } while (EVar6 != index);
    }
  }
  StructBuilder::asReader((StructBuilder *)&local_238);
  SchemaLoader::load(&local_150,(Reader *)&local_208);
  MallocMessageBuilder::~MallocMessageBuilder(&local_128);
  local_268.segment = local_1d8;
  Schema::getProto((Reader *)&local_128,(Schema *)&local_268);
  bVar9 = local_128.super_MessageBuilder.arenaSpace[3]._4_2_ == 0;
  local_208.data = local_128.super_MessageBuilder.arenaSpace[2];
  if (bVar9) {
    local_208.data = (void *)0x0;
  }
  uVar10 = 0x7fffffff;
  if (!bVar9) {
    uVar10 = local_128.super_MessageBuilder.arenaSpace[4]._0_4_;
  }
  local_208.segment._0_4_ = 0;
  local_208.segment._4_4_ = 0;
  local_208.capTable._0_4_ = 0;
  local_208.capTable._4_4_ = 0;
  if (!bVar9) {
    local_208.segment._0_4_ = local_128.super_MessageBuilder._vptr_MessageBuilder._0_4_;
    local_208.segment._4_4_ = local_128.super_MessageBuilder._vptr_MessageBuilder._4_4_;
    local_208.capTable._0_4_ = local_128.super_MessageBuilder.arenaSpace[0]._0_4_;
    local_208.capTable._4_4_ = local_128.super_MessageBuilder.arenaSpace[0]._4_4_;
  }
  local_208.pointers = (WirePointer *)CONCAT44(local_208.pointers._4_4_,uVar10);
  RVar14 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_208,(void *)0x0,0);
  Schema::getProto((Reader *)&local_208,&local_270);
  bVar9 = local_208.pointerCount == 0;
  local_238._reader.data = local_208.pointers;
  if (bVar9) {
    local_238._reader.data = (WirePointer *)0x0;
  }
  local_238._reader.pointers._0_4_ = 0x7fffffff;
  if (!bVar9) {
    local_238._reader.pointers._0_4_ = local_208.nestingLimit;
  }
  uVar10 = 0;
  uVar11 = 0;
  uVar12 = 0;
  uVar13 = 0;
  if (!bVar9) {
    uVar10 = local_208.segment._0_4_;
    uVar11 = local_208.segment._4_4_;
    uVar12 = local_208.capTable._0_4_;
    uVar13 = local_208.capTable._4_4_;
  }
  local_238._reader.segment = (SegmentReader *)CONCAT44(uVar11,uVar10);
  local_238._reader.capTable = (CapTableReader *)CONCAT44(uVar13,uVar12);
  RVar15 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_238,(void *)0x0,0);
  if (RVar14.super_StringPtr.content.size_ == RVar15.super_StringPtr.content.size_) {
    iVar7 = bcmp(RVar14.super_StringPtr.content.ptr,RVar15.super_StringPtr.content.ptr,
                 RVar14.super_StringPtr.content.size_ - 1);
    if (iVar7 == 0) goto LAB_002b9bfa;
  }
  if (kj::_::Debug::minSeverity < 3) {
    local_1a8.segment = local_1d8;
    Schema::getProto((Reader *)&local_128,(Schema *)&local_1a8);
    bVar9 = local_128.super_MessageBuilder.arenaSpace[3]._4_2_ == 0;
    local_208.data = local_128.super_MessageBuilder.arenaSpace[2];
    if (bVar9) {
      local_208.data = (void *)0x0;
    }
    uVar10 = 0x7fffffff;
    if (!bVar9) {
      uVar10 = local_128.super_MessageBuilder.arenaSpace[4]._0_4_;
    }
    local_208.segment._0_4_ = 0;
    local_208.segment._4_4_ = 0;
    local_208.capTable._0_4_ = 0;
    local_208.capTable._4_4_ = 0;
    if (!bVar9) {
      local_208.segment._0_4_ = local_128.super_MessageBuilder._vptr_MessageBuilder._0_4_;
      local_208.segment._4_4_ = local_128.super_MessageBuilder._vptr_MessageBuilder._4_4_;
      local_208.capTable._0_4_ = local_128.super_MessageBuilder.arenaSpace[0]._0_4_;
      local_208.capTable._4_4_ = local_128.super_MessageBuilder.arenaSpace[0]._4_4_;
    }
    local_208.pointers = (WirePointer *)CONCAT44(local_208.pointers._4_4_,uVar10);
    local_268._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&local_208,(void *)0x0,0);
    Schema::getProto((Reader *)&local_208,&local_270);
    bVar9 = local_208.pointerCount == 0;
    local_238._reader.data = local_208.pointers;
    if (bVar9) {
      local_238._reader.data = (WirePointer *)0x0;
    }
    local_238._reader.pointers._0_4_ = 0x7fffffff;
    if (!bVar9) {
      local_238._reader.pointers._0_4_ = local_208.nestingLimit;
    }
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    uVar13 = 0;
    if (!bVar9) {
      uVar10 = local_208.segment._0_4_;
      uVar11 = local_208.segment._4_4_;
      uVar12 = local_208.capTable._0_4_;
      uVar13 = local_208.capTable._4_4_;
    }
    local_238._reader.segment = (SegmentReader *)CONCAT44(uVar11,uVar10);
    local_238._reader.capTable = (CapTableReader *)CONCAT44(uVar13,uVar12);
    local_1d0._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&local_238,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[124],capnp::Text::Reader,capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xce,ERROR,
               "\"failed: expected \" \"(Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())\", Schema::from<test::TestNewVersion>().getProto().getDisplayName(), schema.getProto().getDisplayName()"
               ,(char (*) [124])
                "failed: expected (Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())"
               ,(Reader *)&local_268,(Reader *)&local_1d0);
  }
LAB_002b9bfa:
  Schema::requireUsableAs(&local_270,(RawSchema *)schemas::s_95b30dd14e01dda8);
  SchemaLoader::~SchemaLoader(&local_150);
  return;
}

Assistant:

TEST(SchemaLoader, Upgrade) {
  SchemaLoader loader;

  loader.loadCompiledTypeAndDependencies<test::TestOldVersion>();

  StructSchema schema = loader.get(typeId<test::TestOldVersion>()).asStruct();

  EXPECT_EQ(kj::str(Schema::from<test::TestOldVersion>().getProto()),
            kj::str(schema.getProto()));

  loadUnderAlternateTypeId<test::TestNewVersion>(loader, typeId<test::TestOldVersion>());

  // The new version replaced the old.
  EXPECT_EQ(Schema::from<test::TestNewVersion>().getProto().getDisplayName(),
            schema.getProto().getDisplayName());

  // But it is still usable as the old version.
  schema.requireUsableAs<test::TestOldVersion>();
}